

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::add_escaped_characters(string *str)

{
  bool bVar1;
  reference pcVar2;
  long lVar3;
  undefined8 in_RSI;
  char cVar4;
  string *in_RDI;
  size_type sloc;
  char s;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *out;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff98;
  string *__lhs;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  __lhs = in_RDI;
  local_10 = in_RSI;
  ::std::__cxx11::string::string((string *)in_RDI);
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::reserve((ulong)in_RDI);
  local_30 = local_10;
  local_38._M_current = (char *)::std::__cxx11::string::begin();
  ::std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)__lhs,in_stack_ffffffffffffff98), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_38);
    lVar3 = ::std::__cxx11::string::find_first_of('\x18',(ulong)(uint)(int)*pcVar2);
    cVar4 = (char)in_RDI;
    if (lVar3 == -1) {
      ::std::__cxx11::string::push_back(cVar4);
    }
    else {
      ::std::__cxx11::string::push_back(cVar4);
      ::std::__cxx11::string::operator[](0x1b7938);
      ::std::__cxx11::string::push_back(cVar4);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_38);
  }
  return __lhs;
}

Assistant:

CLI11_INLINE std::string add_escaped_characters(const std::string &str) {
    std::string out;
    out.reserve(str.size() + 4);
    for(char s : str) {
        auto sloc = escapedChars.find_first_of(s);
        if(sloc != std::string::npos) {
            out.push_back('\\');
            out.push_back(escapedCharsCode[sloc]);
        } else {
            out.push_back(s);
        }
    }
    return out;
}